

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinLoader.cpp
# Opt level: O1

aiMatrix4x4 * Read<aiMatrix4x4t<float>>(aiMatrix4x4 *__return_storage_ptr__,IOStream *stream)

{
  uint i;
  int iVar1;
  uint i2;
  long lVar2;
  float fVar3;
  
  __return_storage_ptr__->a1 = 1.0;
  __return_storage_ptr__->a2 = 0.0;
  __return_storage_ptr__->a3 = 0.0;
  __return_storage_ptr__->a4 = 0.0;
  __return_storage_ptr__->b1 = 0.0;
  __return_storage_ptr__->b2 = 1.0;
  __return_storage_ptr__->b3 = 0.0;
  __return_storage_ptr__->b4 = 0.0;
  __return_storage_ptr__->c1 = 0.0;
  __return_storage_ptr__->c2 = 0.0;
  __return_storage_ptr__->c3 = 1.0;
  __return_storage_ptr__->c4 = 0.0;
  __return_storage_ptr__->d1 = 0.0;
  __return_storage_ptr__->d2 = 0.0;
  __return_storage_ptr__->d3 = 0.0;
  __return_storage_ptr__->d4 = 1.0;
  iVar1 = 0;
  do {
    lVar2 = 0;
    do {
      fVar3 = Read<float>(stream);
      (&__return_storage_ptr__->a1)[lVar2] = fVar3;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
    iVar1 = iVar1 + 1;
  } while (iVar1 != 4);
  return __return_storage_ptr__;
}

Assistant:

aiMatrix4x4 Read<aiMatrix4x4>(IOStream * stream) {
    aiMatrix4x4 m;
    for (unsigned int i = 0; i < 4;++i) {
        for (unsigned int i2 = 0; i2 < 4;++i2) {
            m[i][i2] = Read<float>(stream);
        }
    }
    return m;
}